

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

int Maj_ManExactSynthesis(int nVars,int nNodes,int fUseConst,int fUseLine,int fVerbose)

{
  int iVar1;
  bmcg_sat_solver *s;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Maj_Man_t *p;
  abctime aVar8;
  abctime aVar9;
  word *pwVar10;
  abctime time;
  abctime time_00;
  long lVar11;
  ulong uVar12;
  int iMint;
  uint local_6c;
  ulong local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  abctime local_50;
  long local_48 [3];
  
  iMint = 0;
  local_60 = fVerbose;
  local_50 = Abc_Clock();
  p = Maj_ManAlloc(nVars,nNodes,fUseConst,fUseLine);
  iVar5 = Maj_ManAddCnfStart(p);
  if (iVar5 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x174,"int Maj_ManExactSynthesis(int, int, int, int, int)");
  }
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  uVar12 = 0;
  local_6c = 0;
  do {
    if ((int)uVar12 == -1) {
LAB_0049ed74:
      Maj_ManPrintSolution(p);
LAB_0049ed7c:
      Maj_ManFree(p);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x79ba37,(char *)(aVar8 - local_50),time_00);
      return (int)(iMint == -1);
    }
    aVar8 = Abc_Clock();
    iVar5 = Maj_ManAddCnf(p,iMint);
    if (iVar5 == 0) {
LAB_0049ed6d:
      if (iMint != -1) goto LAB_0049ed7c;
      goto LAB_0049ed74;
    }
    s = p->pSat;
    iVar5 = bmcg_sat_solver_solve(s,(int *)0x0,0);
    if (local_60 != 0) {
      printf("Iter %3d : ",(ulong)local_6c);
      Extra_PrintBinary(_stdout,(uint *)&iMint,p->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p->iVar);
      uVar6 = bmcg_sat_solver_clausenum(s);
      printf("Cla =%6d  ",(ulong)uVar6);
      uVar6 = bmcg_sat_solver_conflictnum(s);
      printf("Conf =%9d  ",(ulong)uVar6);
      aVar9 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar9 - aVar8),time);
    }
    if (iVar5 == -1) {
      puts("The problem has no solution.");
      goto LAB_0049ed6d;
    }
    iVar1 = p->nVars;
    local_68 = (ulong)(uint)p->nObjs;
    for (iVar5 = iVar1 + 2; iVar5 < (int)local_68; iVar5 = iVar5 + 1) {
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        iVar7 = Maj_ManFindFanin(p,iVar5,(int)lVar11);
        pwVar10 = Maj_ManTruth(p,iVar7);
        local_48[lVar11] = (long)pwVar10;
      }
      pwVar10 = Maj_ManTruth(p,iVar5);
      uVar6 = p->nWords;
      if (p->nWords < 1) {
        uVar6 = 0;
      }
      for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        uVar2 = *(ulong *)(local_48[1] + uVar12 * 8);
        uVar3 = *(ulong *)(local_48[2] + uVar12 * 8);
        pwVar10[uVar12] = uVar3 & uVar2 | (uVar3 | uVar2) & *(ulong *)(local_48[0] + uVar12 * 8);
      }
    }
    bVar4 = (byte)iVar1 & 0x1f;
    local_5c = 1 << bVar4;
    iVar5 = iVar1 / 2 + 1;
    local_58 = (int)local_68 + -1;
    uVar12 = 0;
    local_54 = iVar5;
    iVar7 = 0;
    if (0 < 1 << bVar4) {
      iVar7 = local_5c;
    }
    for (; iVar7 != (int)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
      if (Abc_TtBitCount8[uVar12 >> 8] + Abc_TtBitCount8[uVar12 & 0xff] <= iVar5 &&
          iVar1 / 2 <= Abc_TtBitCount8[uVar12 >> 8] + Abc_TtBitCount8[uVar12 & 0xff]) {
        pwVar10 = Maj_ManTruth(p,(int)local_68);
        uVar2 = pwVar10[uVar12 >> 6];
        pwVar10 = Maj_ManTruth(p,local_58);
        iVar5 = local_54;
        if (((uVar2 ^ pwVar10[uVar12 >> 6]) >> (uVar12 & 0x3f) & 1) != 0) goto LAB_0049ed4e;
      }
    }
    uVar12 = 0xffffffff;
LAB_0049ed4e:
    if (local_5c <= (int)uVar12) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                    ,0xda,"int Maj_ManEval(Maj_Man_t *)");
    }
    local_6c = local_6c + 1;
    iMint = (int)uVar12;
  } while( true );
}

Assistant:

int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}